

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Swish_x86_avx::forward_inplace(Swish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [32];
  ulong uVar11;
  undefined1 auVar18 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar24 [16];
  undefined1 extraout_var [60];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar30;
  float fVar31;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar28 [32];
  float fVar32;
  undefined1 auVar29 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 local_128 [16];
  float local_d8;
  undefined1 auVar17 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar9 = 0;
    auVar48 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    do {
      auVar45._8_4_ = 0xc2b0c0a5;
      auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar40._8_4_ = 0x42b0c0a5;
      auVar40._0_8_ = 0x42b0c0a542b0c0a5;
      auVar45._12_4_ = 0xc2b0c0a5;
      auVar40._12_4_ = 0x42b0c0a5;
      auVar45._16_4_ = 0xc2b0c0a5;
      auVar40._16_4_ = 0x42b0c0a5;
      auVar45._20_4_ = 0xc2b0c0a5;
      auVar40._20_4_ = 0x42b0c0a5;
      auVar45._24_4_ = 0xc2b0c0a5;
      auVar40._24_4_ = 0x42b0c0a5;
      auVar45._28_4_ = 0xc2b0c0a5;
      auVar40._28_4_ = 0x42b0c0a5;
      pauVar10 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar8 < 8) {
        uVar5 = 0;
      }
      else {
        iVar4 = 7;
        do {
          auVar15 = *pauVar10;
          auVar28._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
          auVar28._8_4_ = auVar15._8_4_ ^ 0x80000000;
          auVar28._12_4_ = auVar15._12_4_ ^ 0x80000000;
          auVar28._16_4_ = auVar15._16_4_ ^ 0x80000000;
          auVar28._20_4_ = auVar15._20_4_ ^ 0x80000000;
          auVar28._24_4_ = auVar15._24_4_ ^ 0x80000000;
          auVar28._28_4_ = auVar15._28_4_ ^ 0x80000000;
          auVar28 = vminps_avx(auVar28,auVar40);
          auVar16 = vmaxps_avx(auVar28,auVar45);
          auVar41._0_4_ = auVar16._0_4_ * 1.442695 + 0.5;
          auVar41._4_4_ = auVar16._4_4_ * 1.442695 + 0.5;
          auVar41._8_4_ = auVar16._8_4_ * 1.442695 + 0.5;
          auVar41._12_4_ = auVar16._12_4_ * 1.442695 + 0.5;
          auVar41._16_4_ = auVar16._16_4_ * 1.442695 + 0.5;
          auVar41._20_4_ = auVar16._20_4_ * 1.442695 + 0.5;
          auVar41._24_4_ = auVar16._24_4_ * 1.442695 + 0.5;
          auVar41._28_4_ = 0x42b1c0a5;
          auVar29 = vroundps_avx(auVar41,1);
          auVar28 = vcmpps_avx(auVar41,auVar29,1);
          auVar28 = vandps_avx(auVar48._0_32_,auVar28);
          auVar28 = vsubps_avx(auVar29,auVar28);
          fVar25 = auVar16._0_4_ + auVar28._0_4_ * -0.6931472;
          fVar30 = auVar16._4_4_ + auVar28._4_4_ * -0.6931472;
          fVar31 = auVar16._8_4_ + auVar28._8_4_ * -0.6931472;
          fVar32 = auVar16._12_4_ + auVar28._12_4_ * -0.6931472;
          fVar33 = auVar16._16_4_ + auVar28._16_4_ * -0.6931472;
          fVar34 = auVar16._20_4_ + auVar28._20_4_ * -0.6931472;
          fVar35 = auVar16._24_4_ + auVar28._24_4_ * -0.6931472;
          auVar36._0_4_ = (int)auVar28._0_4_;
          auVar36._4_4_ = (int)auVar28._4_4_;
          auVar36._8_4_ = (int)auVar28._8_4_;
          auVar36._12_4_ = (int)auVar28._12_4_;
          auVar42._16_4_ = (int)auVar28._16_4_;
          auVar42._0_16_ = auVar36;
          auVar42._20_4_ = (int)auVar28._20_4_;
          auVar42._24_4_ = (int)auVar28._24_4_;
          auVar42._28_4_ = (int)auVar28._28_4_;
          auVar43 = vpslld_avx(auVar36,0x17);
          auVar36 = vpslld_avx(auVar42._16_16_,0x17);
          auVar39._8_4_ = 0x3f800000;
          auVar39._0_8_ = 0x3f8000003f800000;
          auVar39._12_4_ = 0x3f800000;
          auVar36 = vpaddd_avx(auVar36,auVar39);
          auVar43 = vpaddd_avx(auVar43,auVar39);
          auVar29._0_4_ =
               auVar48._0_4_ +
               (auVar48._0_4_ + fVar25 +
               fVar25 * fVar25 *
               (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
                 0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar43._0_4_;
          auVar29._4_4_ =
               auVar48._4_4_ +
               (auVar48._4_4_ + fVar30 +
               fVar30 * fVar30 *
               (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
                 0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5)) * auVar43._4_4_;
          auVar29._8_4_ =
               auVar48._8_4_ +
               (auVar48._8_4_ + fVar31 +
               fVar31 * fVar31 *
               (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                 0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5)) * auVar43._8_4_;
          auVar29._12_4_ =
               auVar48._12_4_ +
               (auVar48._12_4_ + fVar32 +
               fVar32 * fVar32 *
               (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
                 0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5)) * auVar43._12_4_;
          auVar29._16_4_ =
               auVar48._16_4_ +
               (auVar48._16_4_ + fVar33 +
               fVar33 * fVar33 *
               (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
                 0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar36._0_4_;
          auVar29._20_4_ =
               auVar48._20_4_ +
               (auVar48._20_4_ + fVar34 +
               fVar34 * fVar34 *
               (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
                 0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar36._4_4_;
          auVar29._24_4_ =
               auVar48._24_4_ +
               (auVar48._24_4_ + fVar35 +
               fVar35 * fVar35 *
               (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
                 0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar36._8_4_;
          auVar29._28_4_ =
               auVar48._28_4_ + auVar48._28_4_ + auVar16._28_4_ + -0.6931472 + -0.6931472;
          auVar15 = vdivps_avx(auVar15,auVar29);
          *pauVar10 = auVar15;
          pauVar10 = pauVar10 + 1;
          iVar4 = iVar4 + 8;
          uVar5 = uVar8 & 0xfffffff8;
        } while (iVar4 < (int)uVar8);
      }
      auVar43._8_4_ = 0x3f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      auVar43._12_4_ = 0x3f800000;
      auVar46._8_4_ = 0x42b0c0a5;
      auVar46._0_8_ = 0x42b0c0a542b0c0a5;
      auVar46._12_4_ = 0x42b0c0a5;
      auVar47._8_4_ = 0xc2b0c0a5;
      auVar47._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar47._12_4_ = 0xc2b0c0a5;
      uVar7 = uVar5 | 3;
      while ((int)uVar7 < (int)uVar8) {
        auVar36 = *(undefined1 (*) [16])*pauVar10;
        auVar26._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
        auVar26._8_4_ = auVar36._8_4_ ^ 0x80000000;
        auVar26._12_4_ = auVar36._12_4_ ^ 0x80000000;
        auVar39 = vminps_avx(auVar46,auVar26);
        auVar24 = vmaxps_avx(auVar47,auVar39);
        auVar37._0_4_ = auVar24._0_4_ * 1.442695 + 0.5;
        auVar37._4_4_ = auVar24._4_4_ * 1.442695 + 0.5;
        auVar37._8_4_ = auVar24._8_4_ * 1.442695 + 0.5;
        auVar37._12_4_ = auVar24._12_4_ * 1.442695 + 0.5;
        auVar44._0_4_ = (int)auVar37._0_4_;
        auVar44._4_4_ = (int)auVar37._4_4_;
        auVar44._8_4_ = (int)auVar37._8_4_;
        auVar44._12_4_ = (int)auVar37._12_4_;
        auVar26 = vcvtdq2ps_avx(auVar44);
        auVar39 = vcmpps_avx(auVar37,auVar26,1);
        auVar39 = vandps_avx(auVar39,auVar43);
        auVar39 = vsubps_avx(auVar26,auVar39);
        fVar25 = auVar24._0_4_ + auVar39._0_4_ * -0.6931472;
        fVar30 = auVar24._4_4_ + auVar39._4_4_ * -0.6931472;
        fVar31 = auVar24._8_4_ + auVar39._8_4_ * -0.6931472;
        fVar32 = auVar24._12_4_ + auVar39._12_4_ * -0.6931472;
        auVar38._0_4_ = (int)auVar39._0_4_;
        auVar38._4_4_ = (int)auVar39._4_4_;
        auVar38._8_4_ = (int)auVar39._8_4_;
        auVar38._12_4_ = (int)auVar39._12_4_;
        auVar39 = vpslld_avx(auVar38,0x17);
        auVar39 = vpaddd_avx(auVar39,auVar43);
        auVar24._0_4_ =
             (fVar25 + 1.0 +
             fVar25 * fVar25 *
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar39._0_4_ + 1.0;
        auVar24._4_4_ =
             (fVar30 + 1.0 +
             fVar30 * fVar30 *
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5)) * auVar39._4_4_ + 1.0;
        auVar24._8_4_ =
             (fVar31 + 1.0 +
             fVar31 * fVar31 *
             (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
               0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5)) * auVar39._8_4_ + 1.0;
        auVar24._12_4_ =
             (fVar32 + 1.0 +
             fVar32 * fVar32 *
             (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
               0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5)) * auVar39._12_4_ + 1.0;
        auVar36 = vdivps_avx(auVar36,auVar24);
        *(undefined1 (*) [16])*pauVar10 = auVar36;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        uVar7 = uVar5 + 7;
        uVar5 = uVar5 + 4;
      }
      auVar3._8_8_ = 0x8000000000000000;
      auVar3._0_8_ = 0x8000000000000000;
      auVar36 = vpcmpeqd_avx(auVar43,auVar43);
      if ((int)uVar5 < (int)uVar8) {
        uVar6 = CONCAT44(0,~uVar5 + uVar8);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar6;
        auVar46 = vpshufd_avx(auVar12,0x44);
        auVar43 = vpor_avx(auVar46,auVar3);
        auVar39 = vpor_avx(auVar46,auVar3);
        uVar11 = 0;
        auVar40 = _DAT_005a0960;
        do {
          auVar1._8_8_ = 0x8000000000000000;
          auVar1._0_8_ = 0x8000000000000000;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = uVar11;
          auVar47 = vpshufd_avx(auVar13,0x44);
          auVar15._16_16_ = auVar47;
          auVar15._0_16_ = auVar47;
          auVar45 = vorps_avx(auVar15,_DAT_005a0940);
          auVar40 = vorps_avx(auVar15,auVar40);
          auVar24 = vpor_avx(auVar46,auVar1);
          auVar47 = vpcmpgtq_avx(auVar40._16_16_ ^ auVar1,auVar24);
          auVar26 = vpcmpgtq_avx(auVar40._0_16_ ^ auVar1,auVar43);
          auVar47 = vpackssdw_avx(auVar26,auVar47);
          auVar26 = vpcmpgtq_avx(auVar45._16_16_ ^ auVar1,auVar24);
          auVar27._0_8_ = auVar45._0_8_ ^ 0x8000000000000000;
          auVar27._8_4_ = auVar45._8_4_;
          auVar27._12_4_ = auVar45._12_4_ ^ 0x80000000;
          auVar24 = vpcmpgtq_avx(auVar27,auVar39);
          auVar26 = vpackssdw_avx(auVar24,auVar26);
          auVar47 = vpackssdw_avx(auVar26 ^ auVar36,auVar47 ^ auVar36);
          auVar26 = vpmovsxwd_avx(auVar47);
          auVar47 = vpunpckhwd_avx(auVar47,auVar47);
          auVar16._16_16_ = auVar47;
          auVar16._0_16_ = auVar26;
          auVar45 = vmaskmovps_avx(auVar16,*(undefined1 (*) [32])(*pauVar10 + uVar11 * 4));
          auVar14._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
          auVar14._8_4_ = auVar45._8_4_ ^ 0x80000000;
          auVar14._12_4_ = auVar45._12_4_ ^ 0x80000000;
          auVar17._16_4_ = -auVar45._16_4_;
          auVar17._0_16_ = auVar14;
          auVar17._20_4_ = auVar45._20_4_ ^ 0x80000000;
          auVar17._24_4_ = auVar45._24_4_ ^ 0x80000000;
          auVar17._28_4_ = auVar45._28_4_ ^ 0x80000000;
          auVar24 = auVar17._16_16_;
          local_128._0_4_ = expf(auVar17._16_4_);
          local_128._4_4_ = extraout_XMM0_Db;
          local_128._8_4_ = extraout_XMM0_Dc;
          local_128._12_4_ = extraout_XMM0_Dd;
          auVar47 = vpermilps_avx(auVar24,0xf5);
          auVar48._0_4_ = expf(auVar47._0_4_);
          auVar48._4_60_ = extraout_var;
          auVar47 = vinsertps_avx(local_128,auVar48._0_16_,0x10);
          auVar26 = vpermilps_avx(auVar24,0x4e);
          auVar19._0_4_ = expf(auVar26._0_4_);
          auVar19._4_60_ = extraout_var_00;
          auVar47 = vinsertps_avx(auVar47,auVar19._0_16_,0x20);
          auVar26 = vpermilps_avx(auVar24,0xff);
          auVar20._0_4_ = expf(auVar26._0_4_);
          auVar20._4_60_ = extraout_var_01;
          auVar47 = vinsertps_avx(auVar47,auVar20._0_16_,0x30);
          local_d8 = (float)auVar14._0_8_;
          local_128._0_4_ = expf(local_d8);
          local_128._4_4_ = extraout_XMM0_Db_00;
          local_128._8_4_ = extraout_XMM0_Dc_00;
          local_128._12_4_ = extraout_XMM0_Dd_00;
          auVar26 = vpermilps_avx(auVar14,0xf5);
          auVar21._0_4_ = expf(auVar26._0_4_);
          auVar21._4_60_ = extraout_var_02;
          auVar26 = vinsertps_avx(local_128,auVar21._0_16_,0x10);
          auVar24 = vpermilps_avx(auVar14,0x4e);
          auVar22._0_4_ = expf(auVar24._0_4_);
          auVar22._4_60_ = extraout_var_03;
          auVar26 = vinsertps_avx(auVar26,auVar22._0_16_,0x20);
          auVar24 = vpermilps_avx(auVar14,0xff);
          auVar23._0_4_ = expf(auVar24._0_4_);
          auVar40 = _DAT_005a0960;
          auVar23._4_60_ = extraout_var_04;
          auVar36 = vpcmpeqd_avx(auVar36,auVar36);
          auVar48 = ZEXT3264(CONCAT428(0x3f800000,
                                       CONCAT424(0x3f800000,
                                                 CONCAT420(0x3f800000,
                                                           CONCAT416(0x3f800000,
                                                                     CONCAT412(0x3f800000,
                                                                               CONCAT48(0x3f800000,
                                                                                                                                                                                
                                                  0x3f8000003f800000)))))));
          auVar26 = vinsertps_avx(auVar26,auVar23._0_16_,0x30);
          auVar18._0_4_ = auVar26._0_4_ + 1.0;
          auVar18._4_4_ = auVar26._4_4_ + 1.0;
          auVar18._8_4_ = auVar26._8_4_ + 1.0;
          auVar18._12_4_ = auVar26._12_4_ + 1.0;
          auVar18._16_4_ = auVar47._0_4_ + 1.0;
          auVar18._20_4_ = auVar47._4_4_ + 1.0;
          auVar18._24_4_ = auVar47._8_4_ + 1.0;
          auVar18._28_4_ = auVar47._12_4_ + 1.0;
          auVar45 = vdivps_avx(auVar45,auVar18);
          auVar45 = vmaskmovps_avx(auVar16,auVar45);
          *(undefined1 (*) [32])(*pauVar10 + uVar11 * 4) = auVar45;
          uVar11 = uVar11 + 8;
        } while ((uVar6 + 8 & 0xfffffffffffffff8) != uVar11);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return 0;
}

Assistant:

int Swish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}